

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeMemGetAllocProperties
          (ze_context_handle_t hContext,void *ptr,
          ze_memory_allocation_properties_t *pMemAllocProperties,ze_device_handle_t *phDevice)

{
  ze_device_handle_t p_Var1;
  ze_pfnMemGetAllocProperties_t pfnGetAllocProperties;
  ze_result_t result;
  ze_device_handle_t *phDevice_local;
  ze_memory_allocation_properties_t *pMemAllocProperties_local;
  void *ptr_local;
  ze_context_handle_t hContext_local;
  
  pfnGetAllocProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c508 == (code *)0x0) {
    if (phDevice != (ze_device_handle_t *)0x0) {
      p_Var1 = (ze_device_handle_t)context_t::get((context_t *)&context);
      *phDevice = p_Var1;
    }
  }
  else {
    pfnGetAllocProperties._4_4_ = (*DAT_0011c508)(hContext,ptr,pMemAllocProperties,phDevice);
  }
  return pfnGetAllocProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemGetAllocProperties(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr,                                ///< [in] memory pointer to query
        ze_memory_allocation_properties_t* pMemAllocProperties, ///< [in,out] query result for memory allocation properties
        ze_device_handle_t* phDevice                    ///< [out][optional] device associated with this allocation
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetAllocProperties = context.zeDdiTable.Mem.pfnGetAllocProperties;
        if( nullptr != pfnGetAllocProperties )
        {
            result = pfnGetAllocProperties( hContext, ptr, pMemAllocProperties, phDevice );
        }
        else
        {
            // generic implementation
            if( nullptr != phDevice ) *phDevice = reinterpret_cast<ze_device_handle_t>( context.get() );

        }

        return result;
    }